

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O3

char * old_create_transform_action_spec
                 (CMFormatList format_list,CMFormatList out_format_list,char *function)

{
  FMFieldList p_Var1;
  char **ppcVar2;
  int iVar3;
  CMFormatList pCVar4;
  FMStructDescList format_list_00;
  ulong uVar5;
  CMFormatList pCVar6;
  FMStructDescList out_format_list_00;
  char *pcVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  
  if (format_list == (CMFormatList)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0xffffffff;
    pCVar4 = format_list;
    do {
      uVar8 = uVar8 + 1;
      ppcVar2 = &pCVar4->format_name;
      pCVar4 = pCVar4 + 1;
    } while (*ppcVar2 != (char *)0x0);
  }
  uVar5 = (ulong)uVar8;
  pCVar4 = out_format_list;
  format_list_00 = (FMStructDescList)INT_CMmalloc(uVar5 * 0x20 + 0x20);
  uVar10 = 0;
  if (uVar8 == 0) {
    uVar5 = 0;
  }
  else {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)&format_list_00->format_name + lVar9 * 2) =
           *(undefined8 *)((long)&format_list->format_name + lVar9);
      p_Var1 = *(FMFieldList *)((long)&format_list->field_list + lVar9);
      *(FMFieldList *)((long)&format_list_00->field_list + lVar9 * 2) = p_Var1;
      iVar3 = struct_size_field_list(p_Var1,(int)pCVar4);
      *(int *)((long)&format_list_00->struct_size + lVar9 * 2) = iVar3;
      *(undefined8 *)((long)&format_list_00->opt_info + lVar9 * 2) = 0;
      lVar9 = lVar9 + 0x10;
    } while (uVar5 << 4 != lVar9);
  }
  format_list_00[uVar5].format_name = (char *)0x0;
  format_list_00[uVar5].field_list = (FMFieldList)0x0;
  if (out_format_list != (CMFormatList)0x0) {
    uVar10 = 0xffffffff;
    pCVar6 = out_format_list;
    do {
      uVar10 = uVar10 + 1;
      ppcVar2 = &pCVar6->format_name;
      pCVar6 = pCVar6 + 1;
    } while (*ppcVar2 != (char *)0x0);
  }
  uVar5 = (ulong)uVar10;
  out_format_list_00 = (FMStructDescList)INT_CMmalloc(uVar5 * 0x20 + 0x20);
  if (uVar10 == 0) {
    uVar5 = 0;
  }
  else {
    lVar9 = 0;
    do {
      *(undefined8 *)((long)&out_format_list_00->format_name + lVar9 * 2) =
           *(undefined8 *)((long)&out_format_list->format_name + lVar9);
      p_Var1 = *(FMFieldList *)((long)&out_format_list->field_list + lVar9);
      *(FMFieldList *)((long)&out_format_list_00->field_list + lVar9 * 2) = p_Var1;
      iVar3 = struct_size_field_list(p_Var1,(int)pCVar4);
      *(int *)((long)&out_format_list_00->struct_size + lVar9 * 2) = iVar3;
      *(undefined8 *)((long)&out_format_list_00->opt_info + lVar9 * 2) = 0;
      lVar9 = lVar9 + 0x10;
    } while (uVar5 << 4 != lVar9);
  }
  out_format_list_00[uVar5].format_name = (char *)0x0;
  out_format_list_00[uVar5].field_list = (FMFieldList)0x0;
  pcVar7 = create_transform_action_spec(format_list_00,out_format_list_00,function);
  return pcVar7;
}

Assistant:

extern char *
old_create_transform_action_spec(CMFormatList format_list, CMFormatList out_format_list, char *function)
{
    FMStructDescList structs, out_structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;

    count = 0;
    while (out_format_list && (out_format_list[count].format_name != NULL)) count++;
    out_structs = malloc(sizeof(out_structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	out_structs[i].format_name = out_format_list[i].format_name;
	out_structs[i].field_list = out_format_list[i].field_list;
	out_structs[i].struct_size = struct_size_field_list(out_structs[i].field_list, (int)sizeof(char*));
	out_structs[i].opt_info = NULL;
    }
    out_structs[count].format_name = NULL;
    out_structs[count].field_list = NULL;
    return create_transform_action_spec(structs, out_structs, function);
}